

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV2MeshBlock(Parser *this,Mesh *mesh)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  uint iIndex;
  uint iNumCFaces;
  uint iNumCVertices;
  uint iNumTFaces;
  uint iNumTVertices;
  uint iNumFaces;
  uint iNumVertices;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  iVar8 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
LAB_003fa534:
  do {
    while (pcVar2 = this->filePtr, *pcVar2 != '*') {
LAB_003faaa5:
      pbVar3 = (byte *)this->filePtr;
      bVar1 = *pbVar3;
      uVar6 = (uint)bVar1;
      if (bVar1 == 0x7b) {
        iVar8 = iVar8 + 1;
      }
      else if (bVar1 == 0x7d) {
        iVar8 = iVar8 + -1;
        if (iVar8 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (uVar6 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH chunk (Level 2)");
      }
      if (((uVar6 < 0xe) && ((0x3401U >> (uVar6 & 0x1f) & 1) != 0)) &&
         (this->bLastWasEndLine == false)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = (char *)(pbVar3 + 1);
    }
    this->filePtr = pcVar2 + 1;
    iVar5 = strncmp("MESH_NUMVERTEX",pcVar2 + 1,0xe);
    if (iVar5 != 0) {
LAB_003fa55e:
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_NUMTVERTEX",pcVar2,0xf);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0x10;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xf;
          }
          this->filePtr = pcVar7;
          ParseLV4MeshLong(this,&local_3c);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_NUMCVERTEX",pcVar2,0xf);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0x10;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xf;
          }
          this->filePtr = pcVar7;
          ParseLV4MeshLong(this,&local_44);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_NUMFACES",pcVar2,0xd);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xd];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xe;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xd;
          }
          this->filePtr = pcVar7;
          ParseLV4MeshLong(this,&local_38);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_NUMTVFACES",pcVar2,0xf);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0x10;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xf;
          }
          this->filePtr = pcVar7;
          ParseLV4MeshLong(this,&local_40);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_NUMCVFACES",pcVar2,0xf);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xf];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0x10;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xf;
          }
          this->filePtr = pcVar7;
          ParseLV4MeshLong(this,&local_48);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_VERTEX_LIST",pcVar2,0x10);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0x10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0x11;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0x10;
          }
          this->filePtr = pcVar7;
          ParseLV3MeshVertexListBlock(this,local_34,mesh);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_FACE_LIST",pcVar2,0xe);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xe];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xf;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xe;
          }
          this->filePtr = pcVar7;
          ParseLV3MeshFaceListBlock(this,local_38,mesh);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_TVERTLIST",pcVar2,0xe);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xe];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xf;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xe;
          }
          this->filePtr = pcVar7;
          ParseLV3MeshTListBlock(this,local_3c,mesh,0);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_TFACELIST",pcVar2,0xe);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xe];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xf;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xe;
          }
          this->filePtr = pcVar7;
          ParseLV3MeshTFaceListBlock(this,local_40,mesh,0);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_CVERTLIST",pcVar2,0xe);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xe];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xf;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xe;
          }
          this->filePtr = pcVar7;
          ParseLV3MeshCListBlock(this,local_44,mesh);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_CFACELIST",pcVar2,0xe);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xe];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xf;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xe;
          }
          this->filePtr = pcVar7;
          ParseLV3MeshCFaceListBlock(this,local_48,mesh);
          goto LAB_003fa534;
        }
      }
      pcVar2 = this->filePtr;
      iVar5 = strncmp("MESH_NORMALS",pcVar2,0xc);
      if (iVar5 == 0) {
        bVar1 = pcVar2[0xc];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar7 = pcVar2 + 0xd;
          if (bVar1 == 0) {
            pcVar7 = pcVar2 + 0xc;
          }
          this->filePtr = pcVar7;
          ParseLV3MeshNormalListBlock(this,mesh);
          goto LAB_003fa534;
        }
      }
      bVar4 = TokenMatch<char_const>(&this->filePtr,"MESH_MAPPINGCHANNEL",0x13);
      if (bVar4) {
        local_4c = 0;
        ParseLV4MeshLong(this,&local_4c);
        uVar6 = local_4c;
        if (local_4c == 1) {
          LogWarning(this,"Mapping channel has an invalid index. Skipping UV channel");
          SkipSection(this);
        }
        else if (local_4c == 0) {
          LogWarning(this,"Mapping channel has an invalid index. Skipping UV channel");
          SkipSection(this);
          goto LAB_003fa72e;
        }
        if (uVar6 < 9) {
          ParseLV3MappingChannel(this,uVar6 - 1,mesh);
        }
        else {
          LogWarning(this,"Too many UV channels specified. Skipping channel ..");
          SkipSection(this);
        }
      }
      else {
LAB_003fa72e:
        bVar4 = TokenMatch<char_const>(&this->filePtr,"MESH_ANIMATION",0xe);
        if (bVar4) {
          LogWarning(this,
                     "Found *MESH_ANIMATION element in ASE/ASK file. Keyframe animation is not supported by Assimp, this element will be ignored"
                    );
        }
        else {
          bVar4 = TokenMatch<char_const>(&this->filePtr,"MESH_WEIGHTS",0xc);
          if (!bVar4) goto LAB_003faaa5;
          ParseLV3MeshWeightsBlock(this,mesh);
        }
      }
      goto LAB_003fa534;
    }
    bVar1 = pcVar2[0xf];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_003fa55e;
    pcVar7 = pcVar2 + 0x10;
    if (bVar1 == 0) {
      pcVar7 = pcVar2 + 0xf;
    }
    this->filePtr = pcVar7;
    ParseLV4MeshLong(this,&local_34);
  } while( true );
}

Assistant:

void Parser::ParseLV2MeshBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0;
    unsigned int iNumFaces = 0;
    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    unsigned int iNumCVertices = 0;
    unsigned int iNumCFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // Number of vertices in the mesh
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of vertex colors in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumCVertices);
                continue;
            }
            // Number of regular faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMFACES" ,13))
            {
                ParseLV4MeshLong(iNumFaces);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // Number of colored faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVFACES" ,15))
            {
                ParseLV4MeshLong(iNumCFaces);
                continue;
            }
            // mesh vertex list block
            if (TokenMatch(filePtr,"MESH_VERTEX_LIST" ,16))
            {
                ParseLV3MeshVertexListBlock(iNumVertices,mesh);
                continue;
            }
            // mesh face list block
            if (TokenMatch(filePtr,"MESH_FACE_LIST" ,14))
            {
                ParseLV3MeshFaceListBlock(iNumFaces,mesh);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh);
                continue;
            }
            // mesh color vertex list block
            if (TokenMatch(filePtr,"MESH_CVERTLIST" ,14))
            {
                ParseLV3MeshCListBlock(iNumCVertices,mesh);
                continue;
            }
            // mesh color face block
            if (TokenMatch(filePtr,"MESH_CFACELIST" ,14))
            {
                ParseLV3MeshCFaceListBlock(iNumCFaces,mesh);
                continue;
            }
            // mesh normals
            if (TokenMatch(filePtr,"MESH_NORMALS" ,12))
            {
                ParseLV3MeshNormalListBlock(mesh);
                continue;
            }
            // another mesh UV channel ...
            if (TokenMatch(filePtr,"MESH_MAPPINGCHANNEL" ,19)) {
                unsigned int iIndex( 0 );
                ParseLV4MeshLong(iIndex);
                if ( 0 == iIndex ) {
                    LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                    // skip it ...
                    SkipSection();
                } else {
                    if ( iIndex < 2 ) {
                        LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                        // skip it ...
                        SkipSection();
                    }
                    if ( iIndex > AI_MAX_NUMBER_OF_TEXTURECOORDS ) {
                        LogWarning( "Too many UV channels specified. Skipping channel .." );
                        // skip it ...
                        SkipSection();
                    } else {
                        // parse the mapping channel
                        ParseLV3MappingChannel( iIndex - 1, mesh );
                    }
                    continue;
                }
            }
            // mesh animation keyframe. Not supported
            if (TokenMatch(filePtr,"MESH_ANIMATION" ,14))
            {

                LogWarning("Found *MESH_ANIMATION element in ASE/ASK file. "
                    "Keyframe animation is not supported by Assimp, this element "
                    "will be ignored");
                //SkipSection();
                continue;
            }
            if (TokenMatch(filePtr,"MESH_WEIGHTS" ,12))
            {
                ParseLV3MeshWeightsBlock(mesh);continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MESH");
    }
    return;
}